

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.hxx
# Opt level: O2

void __thiscall cornerstone::peer::set_snapshot_in_sync(peer *this,ptr<snapshot> *s)

{
  __shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  if ((s->super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    std::make_shared<cornerstone::snapshot_sync_ctx,std::shared_ptr<cornerstone::snapshot>const&>
              ((shared_ptr<cornerstone::snapshot> *)&local_20);
    std::__shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->snp_sync_ctx_).
                super___shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>,
               &local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
    return;
  }
  std::__shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->snp_sync_ctx_).
              super___shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void set_snapshot_in_sync(const ptr<snapshot>& s)
    {
        if (s == nilptr)
        {
            snp_sync_ctx_.reset();
        }
        else
        {
            snp_sync_ctx_ = cs_new<snapshot_sync_ctx>(s);
        }
    }